

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cpp
# Opt level: O2

void __thiscall despot::Variable::values(Variable *this,string *prefix,int num)

{
  pointer pbVar1;
  mapped_type_conflict *pmVar2;
  int i;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::resize(&this->values_,(long)num);
  uVar5 = 0;
  uVar3 = (ulong)(uint)num;
  if (num < 1) {
    uVar3 = uVar5;
  }
  for (uVar4 = 0; uVar3 != uVar4; uVar4 = uVar4 + 1) {
    to_string<int>(&local_70,(int)uVar4);
    std::operator+(&local_50,prefix,&local_70);
    std::__cxx11::string::operator=
              ((string *)
               ((long)&(((this->values_).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + uVar5),
               (string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    uVar5 = uVar5 + 0x20;
  }
  lVar6 = 0;
  for (uVar3 = 0;
      pbVar1 = (this->values_).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar3 < (ulong)((long)(this->values_).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5);
      uVar3 = uVar3 + 1) {
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::operator[](&this->index_,(key_type *)((long)&(pbVar1->_M_dataplus)._M_p + lVar6));
    *pmVar2 = (mapped_type_conflict)uVar3;
    lVar6 = lVar6 + 0x20;
  }
  return;
}

Assistant:

void Variable::values(string prefix, int num) {
	values_.resize(num);
	for (int i = 0; i < num; i++)
		values_[i] = prefix + to_string(i);

	// NOTE: Index can be computed by stripping of the prefix
	for (int i = 0; i < values_.size(); i++)
		index_[values_[i]] = i;
}